

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LA32Ramp.cpp
# Opt level: O3

void __thiscall MT32Emu::LA32Ramp::startRamp(LA32Ramp *this,Bit8u target,Bit8u increment)

{
  uint uVar1;
  Tables *pTVar2;
  undefined3 in_register_00000011;
  
  if (CONCAT31(in_register_00000011,increment) == 0) {
    this->largeIncrement = 0;
    this->descending = false;
  }
  else {
    pTVar2 = Tables::getInstance();
    uVar1 = (0x1fff - (uint)pTVar2->exp9[(increment & 7) << 6 ^ 0x1ff] << (increment >> 3 & 0xf)) +
            0x40 >> 9;
    this->largeIncrement = uVar1;
    this->descending = (bool)(increment >> 7);
    if ((char)increment < '\0') {
      this->largeIncrement = uVar1 + 1;
    }
  }
  this->largeTarget = (uint)target << 0x12;
  this->interruptCountdown = 0;
  this->interruptRaised = false;
  return;
}

Assistant:

void LA32Ramp::startRamp(Bit8u target, Bit8u increment) {
	// CONFIRMED: From sample analysis, this appears to be very accurate.
	if (increment == 0) {
		largeIncrement = 0;
	} else {
		// Three bits in the fractional part, no need to interpolate
		// (unsigned int)(EXP2F(((increment & 0x7F) + 24) / 8.0f) + 0.125f)
		Bit32u expArg = increment & 0x7F;
		largeIncrement = 8191 - Tables::getInstance().exp9[~(expArg << 6) & 511];
		largeIncrement <<= expArg >> 3;
		largeIncrement += 64;
		largeIncrement >>= 9;
	}
	descending = (increment & 0x80) != 0;
	if (descending) {
		// CONFIRMED: From sample analysis, descending increments are slightly faster
		largeIncrement++;
	}

	largeTarget = target << TARGET_SHIFTS;
	interruptCountdown = 0;
	interruptRaised = false;
}